

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::load_funcset_dep(CVmImageLoader *this,ulong siz)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char buf [256];
  ushort local_138 [132];
  
  if ((this->field_0x90 & 2) != 0) {
    err_throw(0x13b);
  }
  this->field_0x90 = this->field_0x90 | 2;
  CVmBifTable::clear(G_bif_table_X);
  if (1 < siz) {
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,2);
    uVar3 = (uint)local_138[0];
    if (local_138[0] != 0) {
      lVar1 = siz - 2;
      do {
        if (lVar1 == 0) goto LAB_002632bf;
        uVar2 = lVar1 - 1;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,1);
        uVar4 = (ulong)(byte)local_138[0];
        lVar1 = uVar2 - uVar4;
        if (uVar2 < uVar4) goto LAB_002632bf;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,uVar4);
        *(undefined1 *)((long)local_138 + uVar4) = 0;
        CVmBifTable::add_entry(G_bif_table_X,(char *)local_138);
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    return;
  }
LAB_002632bf:
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::load_funcset_dep(VMG_ ulong siz)
{
    char buf[256];
    uint entry_cnt;
    uint i;

    /* it's an error if we've already seen a dependency block */
    if (loaded_funcset_dep_)
        err_throw(VMERR_IMAGE_FUNCDEP_REDEF);

    /* note that we've loaded a dependency block */
    loaded_funcset_dep_ = TRUE;

    /* 
     *   reset the global function set dependency table, in case there was
     *   anything defined by a previously-loaded image - since a function
     *   set index in the table is implicit in the load order, we need to
     *   make sure we're starting with a completely clean configuration 
     */
    G_bif_table->clear(vmg0_);

    /* read the number of entries in the table */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        uint len;

        /* read the length of the entry */
        read_data(buf, 1, &siz);
        len = (uchar)buf[0];

        /* read the name and null-terminate it */
        read_data(buf, len, &siz);
        buf[len] = '\0';

        /* add the dependency */
        G_bif_table->add_entry(vmg_ buf);
    }
}